

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallGenerator.cxx
# Opt level: O1

void __thiscall cmInstallGenerator::~cmInstallGenerator(cmInstallGenerator *this)

{
  ~cmInstallGenerator(this);
  operator_delete(this,200);
  return;
}

Assistant:

cmInstallGenerator::~cmInstallGenerator() = default;